

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parserInternals.c
# Opt level: O3

int xmlCopyCharMultiByte(xmlChar *out,int val)

{
  bool bVar1;
  byte bVar2;
  long lVar3;
  sbyte sVar4;
  uint uVar5;
  
  if (val < 0 || out == (xmlChar *)0x0) {
LAB_00145a67:
    lVar3 = 0;
  }
  else {
    if ((uint)val < 0x80) {
      *out = (xmlChar)val;
      return 1;
    }
    if ((uint)val < 0x800) {
      uVar5 = 0;
      bVar2 = 0xc0;
      sVar4 = 6;
    }
    else if ((uint)val < 0x10000) {
      uVar5 = 6;
      bVar2 = 0xe0;
      sVar4 = 0xc;
    }
    else {
      if (0x10ffff < (uint)val) goto LAB_00145a67;
      uVar5 = 0xc;
      bVar2 = 0xf0;
      sVar4 = 0x12;
    }
    *out = (byte)((uint)val >> sVar4) | bVar2;
    lVar3 = 1;
    do {
      out[lVar3] = (byte)((uint)val >> ((byte)uVar5 & 0x1f)) & 0x3f | 0x80;
      lVar3 = lVar3 + 1;
      bVar1 = 5 < uVar5;
      uVar5 = uVar5 - 6;
    } while (bVar1);
  }
  return (int)lVar3;
}

Assistant:

int
xmlCopyCharMultiByte(xmlChar *out, int val) {
    if ((out == NULL) || (val < 0)) return(0);
    /*
     * We are supposed to handle UTF8, check it's valid
     * From rfc2044: encoding of the Unicode values on UTF-8:
     *
     * UCS-4 range (hex.)           UTF-8 octet sequence (binary)
     * 0000 0000-0000 007F   0xxxxxxx
     * 0000 0080-0000 07FF   110xxxxx 10xxxxxx
     * 0000 0800-0000 FFFF   1110xxxx 10xxxxxx 10xxxxxx
     */
    if  (val >= 0x80) {
	xmlChar *savedout = out;
	int bits;
	if (val <   0x800) { *out++= (val >>  6) | 0xC0;  bits=  0; }
	else if (val < 0x10000) { *out++= (val >> 12) | 0xE0;  bits=  6;}
	else if (val < 0x110000)  { *out++= (val >> 18) | 0xF0;  bits=  12; }
	else {
#ifdef FUZZING_BUILD_MODE_UNSAFE_FOR_PRODUCTION
            xmlAbort("xmlCopyCharMultiByte: codepoint out of range\n");
#endif
	    return(0);
	}
	for ( ; bits >= 0; bits-= 6)
	    *out++= ((val >> bits) & 0x3F) | 0x80 ;
	return (out - savedout);
    }
    *out = val;
    return 1;
}